

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O0

void __thiscall Glucose::MultiSolvers::generateAllSolvers(MultiSolvers *this)

{
  int iVar1;
  ParallelSolver **ppPVar2;
  undefined4 extraout_var;
  vec<Glucose::ParallelSolver_*> *in_RDI;
  ParallelSolver *s;
  int i;
  ParallelSolver **in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  int i_00;
  ParallelSolver *this_00;
  
  for (i_00 = 1; i_00 < *(int *)((long)&in_RDI[2].data + 4); i_00 = i_00 + 1) {
    ppPVar2 = vec<Glucose::ParallelSolver_*>::operator[](in_RDI + 0x14,0);
    iVar1 = (**((*ppPVar2)->super_SimpSolver).super_Solver.super_Clone._vptr_Clone)();
    this_00 = (ParallelSolver *)CONCAT44(extraout_var,iVar1);
    vec<Glucose::ParallelSolver_*>::push(in_RDI,in_stack_ffffffffffffffd8);
    (this_00->super_SimpSolver).super_Solver.verbosity = 0;
    ParallelSolver::setThreadNumber(this_00,i_00);
    this_00->sharedcomp = *(SharedCompanion **)&in_RDI[0xb].sz;
    SharedCompanion::addSolver((SharedCompanion *)CONCAT44(i_00,in_stack_fffffffffffffff0),this_00);
  }
  adjustParameters((MultiSolvers *)0x12f5f0);
  *(undefined4 *)((long)&in_RDI[3].data + 4) = 1;
  return;
}

Assistant:

void MultiSolvers::generateAllSolvers() {
    assert(solvers[0] != NULL);
    assert(allClonesAreBuilt == 0);

    for(int i = 1; i < nbsolvers; i++) {
        ParallelSolver *s = (ParallelSolver *) solvers[0]->clone();
        solvers.push(s);
        s->verbosity = 0; // No reportf in solvers... All is done in MultiSolver
        s->setThreadNumber(i);
        s->sharedcomp = this->sharedcomp;
        this->sharedcomp->addSolver(s);
        assert(solvers[i]->threadNumber() == i);
    }

    adjustParameters();

    allClonesAreBuilt = 1;
}